

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>>
::lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
           *this,DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *rhs)

{
  if (*(long *)(*(long *)this + 8) == *(long *)(rhs + 8)) {
    internal::
    assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3,_0,_0>
    ::run((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *)this,(Matrix<double,__1,_1,_0,__1,_1> *)rhs);
    return (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *)this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Matrix<double, -1, 1>, Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Matrix<double, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, RhsDerived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

inline Index rows() const { return m_matrix.rows(); }